

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O3

bool Imf_3_2::isLossyCompression(Compression c)

{
  return c - B44_COMPRESSION < 4;
}

Assistant:

bool
isLossyCompression (Compression c)
{
    switch (c)
    {
        case B44_COMPRESSION:
        case B44A_COMPRESSION:
        case DWAA_COMPRESSION:
        case DWAB_COMPRESSION: return true;
        default: return false;
    }
}